

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::EnumLiteGenerator
          (EnumLiteGenerator *this,EnumDescriptor *descriptor,bool immutable_api,Context *context)

{
  pointer *ppAVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  ClassNameResolver *pCVar3;
  LogMessageData *pLVar4;
  ulong uVar5;
  Nonnull<const_char_*> failure_msg;
  EnumDescriptor *this_00;
  long v1;
  long lVar6;
  EnumValueDescriptor *value;
  Alias alias;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_48;
  Alias local_40;
  
  (this->super_EnumGenerator)._vptr_EnumGenerator = (_func_int **)&PTR__EnumLiteGenerator_01912040;
  this->descriptor_ = descriptor;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->immutable_api_ = immutable_api;
  this->context_ = context;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  this_00 = this->descriptor_;
  uVar5 = (ulong)(uint)this_00->value_count_;
  if (0 < this_00->value_count_) {
    lVar6 = 0;
    v1 = 0;
    do {
      if ((int)uVar5 <= v1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1,(long)(int)uVar5,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      local_48._M_head_impl = (LogMessageData *)(&this_00->values_->super_SymbolBaseN<0> + lVar6);
      pLVar4 = (LogMessageData *)
               EnumDescriptor::FindValueByNumber
                         (this_00,*(int *)((long)&this_00->values_->number_ + lVar6));
      if (local_48._M_head_impl == pLVar4) {
        __position_00._M_current =
             (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                    ((vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
                      *)&this->canonical_values_,__position_00,(EnumValueDescriptor **)&local_48);
        }
        else {
          *__position_00._M_current = (EnumValueDescriptor *)local_48._M_head_impl;
          pppEVar2 = &(this->canonical_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
        }
      }
      else {
        local_40.value = (EnumValueDescriptor *)local_48._M_head_impl;
        __position._M_current =
             (this->aliases_).
             super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_40.canonical_value = (EnumValueDescriptor *)pLVar4;
        if (__position._M_current ==
            (this->aliases_).
            super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>>
          ::_M_realloc_insert<google::protobuf::compiler::java::EnumLiteGenerator::Alias_const&>
                    ((vector<google::protobuf::compiler::java::EnumLiteGenerator::Alias,std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>>
                      *)&this->aliases_,__position,&local_40);
        }
        else {
          (__position._M_current)->value = (EnumValueDescriptor *)local_48._M_head_impl;
          (__position._M_current)->canonical_value = (EnumValueDescriptor *)pLVar4;
          ppAVar1 = &(this->aliases_).
                     super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      v1 = v1 + 1;
      this_00 = this->descriptor_;
      uVar5 = (ulong)this_00->value_count_;
      lVar6 = lVar6 + 0x30;
    } while (v1 < (long)uVar5);
  }
  return;
}

Assistant:

EnumLiteGenerator::EnumLiteGenerator(const EnumDescriptor* descriptor,
                                     bool immutable_api, Context* context)
    : descriptor_(descriptor),
      immutable_api_(immutable_api),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}